

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

upb_MiniTable *
upb_MiniTable_BuildWithBuf
          (char *data,size_t len,upb_MiniTablePlatform platform,upb_Arena *arena,void **buf,
          size_t *buf_size,upb_Status *status)

{
  upb_MiniTable *puVar1;
  upb_MtDecoder local_140;
  
  memset(&local_140,0,0x100);
  local_140.base.status = status;
  local_140.table = (upb_MiniTable *)upb_Arena_Malloc(arena,0x18);
  local_140.vec.data = (upb_LayoutItem *)*buf;
  local_140.vec.capacity = *buf_size / 0xc;
  local_140.platform = platform;
  local_140.arena = arena;
  puVar1 = upb_MtDecoder_BuildMiniTableWithBuf(&local_140,data,len,buf,buf_size);
  return puVar1;
}

Assistant:

upb_MiniTable* upb_MiniTable_BuildWithBuf(const char* data, size_t len,
                                          upb_MiniTablePlatform platform,
                                          upb_Arena* arena, void** buf,
                                          size_t* buf_size,
                                          upb_Status* status) {
  upb_MtDecoder decoder = {
      .base = {.status = status},
      .platform = platform,
      .vec =
          {
              .data = *buf,
              .capacity = *buf_size / sizeof(*decoder.vec.data),
              .size = 0,
          },
      .arena = arena,
      .table = upb_Arena_Malloc(arena, sizeof(*decoder.table)),
  };

  return upb_MtDecoder_BuildMiniTableWithBuf(&decoder, data, len, buf,
                                             buf_size);
}